

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_store.cxx
# Opt level: O3

void test_log_store_compact_random(void)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  EVP_PKEY_CTX *ctx;
  fs_log_store *this;
  size_t i;
  ulong uVar8;
  long lVar9;
  iterator __first;
  ptr<log_entry> entry;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  entries;
  ptr<log_entry> entry_3;
  fs_log_store store;
  random_device rd;
  undefined1 local_1ab8 [16];
  _Manager_type local_1aa8;
  _Invoker_type local_1aa0;
  code *local_1a98;
  code *local_1a90;
  string local_1a88;
  undefined1 local_1a68 [16];
  fs_log_store local_1a58;
  EVP_PKEY_CTX local_13b8 [5000];
  
  ctx = local_13b8;
  std::random_device::random_device((random_device *)ctx);
  uVar1 = std::random_device::_M_getval();
  uVar6 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  local_1aa0 = (_Invoker_type)(ulong)(uVar6 + uVar1 + (uint)(uVar1 + uVar6 == 0));
  local_1aa8 = (_Manager_type)0x271000000001;
  local_1a90 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/tests/src/test_log_store.cxx:310:34)>
               ::_M_invoke;
  local_1a98 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/tests/src/test_log_store.cxx:310:34)>
               ::_M_manager;
  cleanup(ctx);
  local_1a88._M_dataplus._M_p = (pointer)&local_1a88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a88,".","");
  cornerstone::fs_log_store::fs_log_store(&local_1a58,&local_1a88,1000);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a88._M_dataplus._M_p != &local_1a88.field_2) {
    operator_delete(local_1a88._M_dataplus._M_p,local_1a88.field_2._M_allocated_capacity + 1);
  }
  if (local_1a98 == (code *)0x0) {
    std::__throw_bad_function_call();
  }
  iVar2 = (*local_1a90)();
  local_1a88._M_dataplus._M_p = (pointer)0x0;
  local_1a88._M_string_length = 0;
  local_1a88.field_2._M_allocated_capacity = 0;
  uVar7 = 0xfffffffffffffff6;
  if (-100 < iVar2 % 1000) {
    iVar2 = iVar2 % 1000 + 100;
    do {
      rnd_entry((function<int_()> *)local_1ab8);
      cornerstone::fs_log_store::append(&local_1a58,(ptr<log_entry> *)local_1ab8);
      std::
      vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
      ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   *)&local_1a88,(value_type *)local_1ab8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ab8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ab8._8_8_);
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    uVar7 = ((long)(local_1a88._M_string_length - (long)local_1a88._M_dataplus._M_p) >> 4) - 10;
  }
  if (local_1a98 == (code *)0x0) {
    std::__throw_bad_function_call();
  }
  iVar2 = (*local_1a90)();
  uVar8 = 0;
  uVar7 = (ulong)(long)iVar2 % uVar7;
  while( true ) {
    uVar3 = cornerstone::fs_log_store::next_slot(&local_1a58);
    if ((uVar3 - uVar7) - 2 <= uVar8) break;
    cornerstone::fs_log_store::start_index(&local_1a58);
    cornerstone::fs_log_store::entry_at((fs_log_store *)local_1ab8,(ulong)&local_1a58);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ab8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ab8._8_8_);
    }
    uVar8 = uVar8 + 1;
  }
  if (local_1a98 == (code *)0x0) {
    std::__throw_bad_function_call();
  }
  iVar2 = (*local_1a90)();
  uVar3 = cornerstone::fs_log_store::next_slot(&local_1a58);
  uVar4 = cornerstone::fs_log_store::start_index(&local_1a58);
  uVar5 = cornerstone::fs_log_store::start_index(&local_1a58);
  rnd_entry((function<int_()> *)local_1ab8);
  uVar5 = (ulong)(long)iVar2 % (uVar3 - uVar4) + uVar5;
  cornerstone::fs_log_store::write_at(&local_1a58,uVar5,(ptr<log_entry> *)local_1ab8);
  lVar9 = uVar5 * 0x10;
  *(undefined8 *)(local_1a88._M_dataplus._M_p + lVar9 + -0x10) = local_1ab8._0_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_1a88._M_dataplus._M_p + lVar9 + -8),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1ab8 + 8));
  __first._M_current = (shared_ptr<cornerstone::log_entry> *)(local_1a88._M_dataplus._M_p + lVar9);
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ::_M_erase((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
              *)&local_1a88,__first,(iterator)local_1a88._M_string_length);
  uVar8 = 0;
  while( true ) {
    uVar3 = cornerstone::fs_log_store::next_slot(&local_1a58);
    if ((uVar3 - uVar7) - 2 <= uVar8) break;
    cornerstone::fs_log_store::start_index(&local_1a58);
    __first._M_current = (shared_ptr<cornerstone::log_entry> *)&local_1a58;
    cornerstone::fs_log_store::entry_at((fs_log_store *)local_1a68,(ulong)&local_1a58);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._8_8_);
    }
    uVar8 = uVar8 + 1;
  }
  if (local_1a98 != (code *)0x0) {
    iVar2 = (*local_1a90)();
    if (-10 < iVar2 % 100) {
      iVar2 = iVar2 % 100 + 10;
      do {
        rnd_entry((function<int_()> *)local_1a68);
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                     *)&local_1a88,(value_type *)local_1a68);
        __first._M_current = (shared_ptr<cornerstone::log_entry> *)local_1a68;
        cornerstone::fs_log_store::append(&local_1a58,(ptr<log_entry> *)local_1a68);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._8_8_);
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    uVar8 = 0;
    while( true ) {
      iVar2 = (int)__first._M_current;
      uVar3 = cornerstone::fs_log_store::next_slot(&local_1a58);
      if ((uVar3 - uVar7) - 2 <= uVar8) break;
      cornerstone::fs_log_store::start_index(&local_1a58);
      __first._M_current = (shared_ptr<cornerstone::log_entry> *)&local_1a58;
      cornerstone::fs_log_store::entry_at((fs_log_store *)local_1a68,(ulong)&local_1a58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a68._8_8_);
      }
      uVar8 = uVar8 + 1;
    }
    this = &local_1a58;
    cornerstone::fs_log_store::close(this,iVar2);
    cleanup((EVP_PKEY_CTX *)this);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ab8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1ab8._8_8_);
    }
    std::
    vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
    ::~vector((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               *)&local_1a88);
    cornerstone::fs_log_store::~fs_log_store(&local_1a58);
    if (local_1a98 != (code *)0x0) {
      (*local_1a98)(&local_1aa8,&local_1aa8,3);
    }
    std::random_device::_M_fini();
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void test_log_store_compact_random()
{
    std::random_device rd;
    std::default_random_engine engine(rd());
    std::uniform_int_distribution<int32> distribution(1, 10000);
    std::function<int32()> rnd = [distribution, engine]() mutable -> int32_t { return distribution(engine); };

    cleanup();
    fs_log_store store(".", 1000);
    int cnt = rnd() % 1000 + 100;
    std::vector<ptr<log_entry>> entries;
    for (int i = 0; i < cnt; ++i)
    {
        ptr<log_entry> entry(rnd_entry(rnd));
        store.append(entry);
        entries.push_back(entry);
    }

    ulong last_log_idx = entries.size();
    ulong idx_to_compact = rnd() % (last_log_idx - 10) + 1;
    assert(store.compact(idx_to_compact));

    assert(store.start_index() == (idx_to_compact + 1));
    assert(store.next_slot() == (entries.size() + 1));

    for (size_t i = 0; i < store.next_slot() - idx_to_compact - 1; ++i)
    {
        ptr<log_entry> entry = store.entry_at(store.start_index() + i);
        assert(entry_equals(*entry, *entries[i + (size_t)idx_to_compact]));
    }

    ulong rnd_idx = (ulong)rnd() % (store.next_slot() - store.start_index()) + store.start_index();
    ptr<log_entry> entry = rnd_entry(rnd);
    store.write_at(rnd_idx, entry);
    entries[(size_t)rnd_idx - 1] = entry;
    entries.erase(entries.begin() + (size_t)rnd_idx, entries.end());

    for (size_t i = 0; i < store.next_slot() - idx_to_compact - 1; ++i)
    {
        ptr<log_entry> entry = store.entry_at(store.start_index() + i);
        assert(entry_equals(*entry, *entries[i + (size_t)idx_to_compact]));
    }

    cnt = rnd() % 100 + 10;
    for (int i = 0; i < cnt; ++i)
    {
        ptr<log_entry> entry = rnd_entry(rnd);
        entries.push_back(entry);
        store.append(entry);
    }

    for (size_t i = 0; i < store.next_slot() - idx_to_compact - 1; ++i)
    {
        ptr<log_entry> entry = store.entry_at(store.start_index() + i);
        assert(entry_equals(*entry, *entries[i + (size_t)idx_to_compact]));
    }
    store.close();
    cleanup();
}